

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSynth.c
# Opt level: O2

int Gia_TransferMappedClasses(Gia_Man_t *pPart,int *pMapBack,int *pReprs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  
  if (pPart->pReprs == (Gia_Rpr_t *)0x0) {
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    for (lVar7 = 0; lVar7 < pPart->nObjs; lVar7 = lVar7 + 1) {
      pGVar4 = Gia_ManObj(pPart,(int)lVar7);
      if (pGVar4 == (Gia_Obj_t *)0x0) {
        return iVar6;
      }
      uVar5 = (ulong)(uint)pPart->pReprs[lVar7] & 0xfffffff;
      if (uVar5 != 0xfffffff) {
        if (pPart->nObjs <= lVar7) {
          __assert_fail("i < Gia_ManObjNum(pPart)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSynth.c"
                        ,0xd7,"int Gia_TransferMappedClasses(Gia_Man_t *, int *, int *)");
        }
        if (pPart->nObjs <= (int)uVar5) {
          __assert_fail("Gia_ObjRepr(pPart, i) < Gia_ManObjNum(pPart)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSynth.c"
                        ,0xd8,"int Gia_TransferMappedClasses(Gia_Man_t *, int *, int *)");
        }
        iVar1 = pMapBack[lVar7];
        iVar2 = pMapBack[uVar5];
        if (iVar1 != iVar2) {
          iVar3 = iVar2;
          if (iVar2 < iVar1) {
            iVar3 = iVar1;
          }
          if (iVar1 < iVar2) {
            iVar2 = iVar1;
          }
          pReprs[iVar3] = iVar2;
          iVar6 = iVar6 + 1;
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int Gia_TransferMappedClasses( Gia_Man_t * pPart, int * pMapBack, int * pReprs )
{
    Gia_Obj_t * pObj;
    int i, Id1, Id2, nClasses;
    if ( pPart->pReprs == NULL ) 
        return 0;
    nClasses = 0;
    Gia_ManForEachObj( pPart, pObj, i )
    {
        if ( Gia_ObjRepr(pPart, i) == GIA_VOID )
            continue;
        assert( i                     < Gia_ManObjNum(pPart) );
        assert( Gia_ObjRepr(pPart, i) < Gia_ManObjNum(pPart) );
        Id1 = pMapBack[ i ];
        Id2 = pMapBack[ Gia_ObjRepr(pPart, i) ];
        if ( Id1 == Id2 )
            continue;
        if ( Id1 < Id2 )
            pReprs[Id2] = Id1;
        else
            pReprs[Id1] = Id2;
        nClasses++;
    }
    return nClasses;
}